

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MultiQuery.cpp
# Opt level: O0

void __thiscall
MultiQuery<dto::Complex,_dto::Simple>::MultiQuery
          (MultiQuery<dto::Complex,_dto::Simple> *this,Complex *req,uint16_t port,string *addr,
          int timeout)

{
  uint16_t uVar1;
  int iVar2;
  char *__cp;
  undefined4 local_80;
  int local_7c;
  int optval;
  int sock;
  sockaddr_in remote_address;
  allocator<char> local_51;
  string local_50;
  int local_2c;
  string *psStack_28;
  int timeout_local;
  string *addr_local;
  Complex *pCStack_18;
  uint16_t port_local;
  Complex *req_local;
  MultiQuery<dto::Complex,_dto::Simple> *this_local;
  
  local_2c = timeout;
  psStack_28 = addr;
  addr_local._6_2_ = port;
  pCStack_18 = req;
  req_local = (Complex *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,"MultiQuery",&local_51);
  Subscriber::Subscriber(&this->super_Subscriber,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator(&local_51);
  (this->super_Subscriber)._vptr_Subscriber = (_func_int **)&PTR_on_error_001ed780;
  ::dto::Complex::Complex(&this->req,pCStack_18);
  std::function<void_(dto::Simple_&,_sockaddr_in)>::function(&this->callback);
  std::function<void_()>::function(&this->error);
  std::function<void_()>::function(&this->done);
  std::__cxx11::string::string((string *)&this->addr,(string *)addr);
  this->timeout = local_2c;
  _optval = 0;
  remote_address.sin_family = 0;
  remote_address.sin_port = 0;
  remote_address.sin_addr.s_addr = 0;
  iVar2 = socket(2,2,0);
  local_7c = no_err(iVar2,"Could not open udp socket");
  local_80 = 1;
  iVar2 = setsockopt(local_7c,1,6,&local_80,4);
  no_err(iVar2,"setsockopt SO_BROADCAST");
  local_80 = 4;
  iVar2 = setsockopt(local_7c,0,0x21,&local_80,4);
  no_err(iVar2,"setscokopt TTL");
  _optval = CONCAT62(stack0xffffffffffffff8a,2);
  uVar1 = htons(addr_local._6_2_);
  optval = CONCAT22(uVar1,(undefined2)optval);
  __cp = (char *)std::__cxx11::string::operator[]((ulong)addr);
  iVar2 = inet_aton(__cp,(in_addr *)&sock);
  no_err(iVar2,"inet_aton");
  (this->remote).sin_family = (undefined2)optval;
  (this->remote).sin_port = optval._2_2_;
  (this->remote).sin_addr = (in_addr)sock;
  *(undefined8 *)(this->remote).sin_zero = remote_address._0_8_;
  Subscriber::set_fd(&this->super_Subscriber,local_7c);
  Subscriber::set_expected(&this->super_Subscriber,4);
  return;
}

Assistant:

MultiQuery<REQ, RES>::MultiQuery(REQ &req, uint16_t port, std::string addr, int timeout) :
    Subscriber("MultiQuery"),
    req(std::move(req)),
    addr(addr), timeout(timeout) {

  struct sockaddr_in remote_address{};

  int sock = no_err(socket(AF_INET, SOCK_DGRAM, 0), "Could not open udp socket");

  int optval = 1;
  no_err(setsockopt(sock, SOL_SOCKET, SO_BROADCAST, (void *) &optval, sizeof optval), "setsockopt SO_BROADCAST");
  optval = 4;
  no_err(setsockopt(sock, IPPROTO_IP, IP_MULTICAST_TTL, (void *) &optval, sizeof optval), "setscokopt TTL");

  remote_address.sin_family = AF_INET;
  remote_address.sin_port = htons(port);
  no_err(inet_aton(&addr[0], &remote_address.sin_addr), "inet_aton");
  remote = remote_address;
  set_fd(sock);
  set_expected(POLLOUT);
}